

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Match(TableType *expected,TableType *actual,string *out_msg)

{
  Result RVar1;
  Enum EVar2;
  char *pcVar3;
  char *pcVar4;
  string local_40;
  
  local_40._M_dataplus._M_p._0_4_ = *(int *)&(expected->super_ExternType).field_0xc;
  if ((int)local_40._M_dataplus._M_p == *(int *)&(actual->super_ExternType).field_0xc) {
    RVar1 = Match(&expected->limits,&actual->limits,out_msg);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  else {
    pcVar3 = Type::GetName((Type *)&local_40);
    local_40._M_dataplus._M_p._0_4_ = *(int *)&(actual->super_ExternType).field_0xc;
    pcVar4 = Type::GetName((Type *)&local_40);
    StringPrintf_abi_cxx11_
              (&local_40,"type mismatch in imported table, expected %s but got %s.",pcVar3,pcVar4);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p));
    }
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result Match(const TableType& expected,
             const TableType& actual,
             std::string* out_msg) {
  if (expected.element != actual.element) {
    *out_msg =
        StringPrintf("type mismatch in imported table, expected %s but got %s.",
                     GetName(expected.element), GetName(actual.element));
    return Result::Error;
  }

  if (Failed(Match(expected.limits, actual.limits, out_msg))) {
    return Result::Error;
  }

  return Result::Ok;
}